

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifier.c
# Opt level: O3

int flatcc_verify_struct_as_typed_root_with_size
              (void *buf,size_t bufsiz,flatbuffers_thash_t thash,size_t size,uint16_t align)

{
  flatbuffers_thash_t fVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  
  iVar2 = 5;
  if (((((ulong)buf & 3) == 0) && (iVar2 = 6, bufsiz >> 3 < 0x1fffffff)) &&
     (iVar2 = 1, 0xb < bufsiz)) {
    iVar2 = 0x24;
    if ((ulong)*buf <= bufsiz - 4) {
      fVar1 = *(flatbuffers_thash_t *)((long)buf + 4);
      if (thash == 0) {
        thash = fVar1;
        if (fVar1 == 0) {
          return 0x12;
        }
      }
      else if (fVar1 != thash) {
        return (uint)(*(flatbuffers_thash_t *)((long)buf + 4) != thash) * 2;
      }
      uVar4 = *buf + 4;
      uVar3 = thash + 4;
      iVar2 = 0x12;
      if (uVar3 <= uVar4) {
        iVar2 = 10;
        if ((!CARRY4((uint)size,uVar3)) && (iVar2 = 9, (uint)size + uVar3 <= uVar4)) {
          iVar2 = 0xb;
          if ((uVar3 & align - 1) == 0) {
            iVar2 = 0;
          }
          return iVar2;
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int flatcc_verify_struct_as_typed_root_with_size(const void *buf, size_t bufsiz, flatbuffers_thash_t thash, size_t size, uint16_t align)
{
    check_result(flatcc_verify_typed_buffer_header_with_size(buf, &bufsiz, thash));
    return verify_struct((uoffset_t)bufsiz, uoffset_size, read_uoffset(buf, uoffset_size), (uoffset_t)size, align);
}